

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricQueryPoolCreatePrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_device_handle_t hDevice,
          zet_metric_group_handle_t hMetricGroup,zet_metric_query_pool_desc_t *desc,
          zet_metric_query_pool_handle_t *phMetricQueryPool)

{
  pointer p_Var1;
  ze_result_t zVar2;
  initializer_list<_zet_structure_type_t> __l;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> baseTypes;
  allocator_type local_35;
  _zet_structure_type_t local_34;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> local_30;
  
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (((hMetricGroup != (zet_metric_group_handle_t)0x0 &&
        (hDevice != (zet_device_handle_t)0x0 && hContext != (zet_context_handle_t)0x0)) &&
      (zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER,
      phMetricQueryPool != (zet_metric_query_pool_handle_t *)0x0 &&
      desc != (zet_metric_query_pool_desc_t *)0x0)) &&
     (zVar2 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)desc->type < 2)) {
    local_34 = ZET_STRUCTURE_TYPE_METRIC_QUERY_POOL_DESC;
    __l._M_len = 1;
    __l._M_array = &local_34;
    std::vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>::vector
              (&local_30,__l,&local_35);
    zVar2 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
    if (local_30.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_30.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      p_Var1 = local_30.
               super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (desc->stype == *p_Var1) {
          if (((int *)desc->pNext == (int *)0x0) || (*desc->pNext < 0x100000)) {
            zVar2 = ZE_RESULT_SUCCESS;
          }
          break;
        }
        p_Var1 = p_Var1 + 1;
      } while (p_Var1 != local_30.
                         super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_30.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (zet_structure_type_t *)0x0) {
      operator_delete(local_30.
                      super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricQueryPoolCreatePrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        zet_metric_group_handle_t hMetricGroup,         ///< [in] metric group associated with the query object.
        const zet_metric_query_pool_desc_t* desc,       ///< [in] metric query pool descriptor
        zet_metric_query_pool_handle_t* phMetricQueryPool   ///< [out] handle of metric query pool
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hMetricGroup )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phMetricQueryPool )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZET_METRIC_QUERY_POOL_TYPE_EXECUTION < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }